

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall client_socket::impl::~impl(impl *this)

{
  if (this->destroyed != (bool *)0x0) {
    *this->destroyed = true;
  }
  sysapi::epoll_registration::~epoll_registration(&this->reg);
  std::_Function_base::~_Function_base(&(this->on_write_ready).super__Function_base);
  std::_Function_base::~_Function_base(&(this->on_read_ready).super__Function_base);
  std::_Function_base::~_Function_base(&(this->on_disconnect).super__Function_base);
  file_descriptor::~file_descriptor(&this->fd);
  return;
}

Assistant:

client_socket::impl::~impl()
{
    if (destroyed)
        *destroyed = true;
}